

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu580.c
# Opt level: O1

MPP_RET hal_h265e_v580_start(void *hal,HalEncTask *enc_task)

{
  undefined1 *puVar1;
  byte *pbVar2;
  anon_struct_4_2_edbc1122_for_reg0246_synt_long_refm0 aVar3;
  MppDevRegOffCfgs *pMVar4;
  MppDev ctx;
  HalEncTask *pHVar5;
  hevc_vepu580_base *phVar6;
  MppFrameFormat MVar7;
  RK_U32 RVar8;
  MPP_RET MVar9;
  anon_struct_4_4_5bc86bfe_for_reg0200_src_udfu aVar10;
  anon_struct_4_4_5bc8e43d_for_reg0201_src_udfv aVar11;
  anon_struct_4_4_3b0f98d5_for_reg0196_enc_rsl aVar12;
  RK_U32 RVar13;
  hevc_vepu580_base *__dest;
  void *pvVar14;
  size_t sVar15;
  uint uVar16;
  long lVar17;
  ushort uVar18;
  uint uVar19;
  char *fmt;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  long lVar31;
  MppBuffer *ppvVar32;
  bool bVar33;
  MppDevRegWrCfg cfg;
  hevc_vepu580_base *local_c0;
  undefined8 local_b8;
  H265eSyntax_new *local_b0;
  HalEncTask *local_a8;
  int local_9c;
  long local_98;
  ulong local_90;
  void *local_88;
  hevc_vepu580_base *local_80;
  MppBuffer *local_78;
  void *local_70;
  undefined8 local_68;
  MppBuffer *local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  uint *local_38;
  
  lVar31 = *(long *)((long)hal + 0x80);
  local_b0 = *(H265eSyntax_new **)((long)hal + 0xd0);
  uVar16 = ((local_b0->pp).num_tile_rows_minus1 + 1) * ((local_b0->pp).num_tile_columns_minus1 + 1);
  local_38 = *(uint **)((long)hal + 0x110);
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) enter\n",(char *)0x0,0xb46);
  }
  *(uint *)((long)hal + 0xe8) = uVar16;
  if ((enc_task->flags).err == 0) {
    if (uVar16 < 5) {
      local_58 = lVar31 + 0x1b0;
      local_60 = &enc_task->output;
      local_78 = (MppBuffer *)((long)hal + 0xf8);
      local_48 = (ulong)(uVar16 - 1);
      local_50 = (ulong)uVar16;
      uVar21 = 0;
      local_90 = 0;
      local_9c = 0;
      local_a8 = enc_task;
      local_98 = lVar31;
      local_40 = (ulong)uVar16;
      do {
        __dest = *(hevc_vepu580_base **)(lVar31 + 0x18 + uVar21 * 8);
        pvVar14 = *(void **)(lVar31 + 0x38 + uVar21 * 8);
        if (__dest == (hevc_vepu580_base *)0x0) {
          __dest = (hevc_vepu580_base *)mpp_osal_malloc("hal_h265e_v580_start",0x1d08);
          *(hevc_vepu580_base **)(lVar31 + 0x18 + uVar21 * 8) = __dest;
        }
        if (pvVar14 == (void *)0x0) {
          pvVar14 = mpp_osal_malloc("hal_h265e_v580_start",0x2d4);
          *(void **)(lVar31 + 0x38 + uVar21 * 8) = pvVar14;
        }
        if (uVar21 != 0) {
          memcpy(__dest,*(void **)(lVar31 + 0x18),0x1d08);
        }
        uVar25 = __dest->reserved248_251[0];
        uVar16 = (int)__dest->reg0244_synt_refm2 * 4;
        uVar24 = uVar16 & 0x3c;
        uVar22 = uVar25 & 0x1fff;
        uVar19 = ((uint)__dest->reg0220_me_rnge & 0x7ff) * 8 + 0x47 >> 6;
        if (((uint)(local_b0->pp).field_22 & 0x80) == 0) {
          uVar22 = uVar22 - uVar24;
          if ((int)uVar22 < 0) {
            uVar26 = uVar22 - 0xf;
            if ((int)(uVar22 - 0xf) < 0) {
              uVar26 = uVar22;
            }
            uVar22 = (int)uVar26 >> 4;
          }
          else {
            uVar22 = uVar22 >> 4;
          }
          uVar19 = uVar19 - 1;
          uVar27 = uVar19;
          if ((int)uVar22 < (int)uVar19) {
            uVar27 = uVar22;
          }
          if ((int)uVar22 < 0) {
            uVar27 = 0;
          }
        }
        else {
          uVar26 = uVar22 - uVar24;
          if ((int)uVar26 < 0) {
            uVar27 = uVar26 - 0xf;
            if ((int)(uVar26 - 0xf) < 0) {
              uVar27 = uVar26;
            }
            uVar26 = (int)uVar27 >> 4;
          }
          else {
            uVar26 = uVar26 >> 4;
          }
          uVar26 = uVar26 + (int)local_90;
          uVar19 = uVar19 - 1;
          uVar27 = uVar19;
          if ((int)uVar26 < (int)uVar19) {
            uVar27 = uVar26;
          }
          if ((int)uVar26 < 0) {
            uVar27 = 0;
          }
          uVar22 = (local_b0->pp).column_width_minus1[uVar21] + (int)local_90 +
                   (uVar22 + uVar24 + 0xf >> 4);
          if ((int)uVar22 < (int)uVar19) {
            uVar19 = uVar22;
          }
          if ((int)uVar22 < 0) {
            uVar19 = 0;
          }
        }
        uVar22 = (uVar19 - uVar27) * 0x40 + 0x40;
        uVar19 = (uVar22 & 0x7fc0) << 0xc;
        if (uVar22 == 0) {
          uVar19 = 0x40000;
        }
        aVar3 = __dest->reg0246_synt_long_refm0;
        __dest->reg0246_synt_long_refm0 =
             (anon_struct_4_2_edbc1122_for_reg0246_synt_long_refm0)
             ((uint)aVar3 & 0xf803ffff | uVar19);
        uVar16 = (uVar25 & 0xf) - (uVar16 & 0xc);
        if ((int)uVar16 < 0) {
          iVar28 = (int)uVar16 % 0x10 + uVar24 * 2 + 0x10;
        }
        else {
          iVar28 = (uVar16 & 0xf) + uVar24 * 2;
        }
        uVar29 = iVar28 + 0xfU >> 4;
        uVar22 = uVar25 >> 0x10 & 3;
        uVar24 = (uint)__dest->reg0244_synt_refm2 >> 1 & 0x78;
        uVar25 = uVar22 + uVar24 + 3 >> 2;
        uVar16 = uVar25 + 4;
        uVar26 = uVar25 + 7 & 0xfffffffc;
        uVar27 = uVar19 >> 0x12;
        uVar25 = uVar29 + 1;
        if (uVar27 <= uVar29) {
          uVar25 = uVar27;
        }
        uVar23 = uVar19 >> 0x10;
        uVar29 = 4;
        if (4 < uVar26) {
          iVar28 = uVar23 * -4;
          uVar30 = 4;
          do {
            iVar28 = iVar28 + uVar23 * 4;
            lVar31 = local_98;
            uVar29 = uVar30;
            if (0x99f < uVar25 * 4 * uVar16 + iVar28) break;
            uVar30 = uVar30 + 4;
            bVar33 = uVar16 < 9;
            uVar16 = uVar16 - 4;
            if (bVar33) {
              uVar16 = 4;
            }
            uVar29 = uVar26;
          } while (uVar30 < uVar26);
        }
        iVar28 = uVar16 << 2;
        if (uVar22 == 0 && uVar24 == 0) {
          iVar28 = 0;
          uVar29 = uVar29 + 4;
        }
        if (0x9a0 < iVar28 * uVar25 + uVar23 * (uVar29 - 4)) {
          uVar29 = uVar29 - 4;
        }
        uVar16 = (uVar29 + 0x1ffc >> 2) * uVar27 + uVar25 & 0x7ff;
        __dest->reg0246_synt_long_refm0 =
             (anon_struct_4_2_edbc1122_for_reg0246_synt_long_refm0)
             ((uint)aVar3 & 0xf8030000 | uVar19 | (uVar29 & 0x1f) << 0xb | uVar16);
        local_88 = pvVar14;
        if (((byte)hal_h265e_debug & 8) != 0) {
          _mpp_log_l(4,"hal_h265e_v580","cime_rama_h %d, cime_rama_max %d, cime_linebuf_w %d",
                     (char *)0x0,(ulong)(uVar29 & 0x1c),(ulong)uVar16,uVar27);
        }
        pHVar5 = local_a8;
        pMVar4 = *(MppDevRegOffCfgs **)(lVar31 + 0x218);
        uVar16 = *local_38;
        MVar7 = mpp_frame_get_fmt(local_a8->frame);
        uVar18 = (local_b0->pp).ver_stride;
        if (uVar18 == 0) {
          uVar18 = (local_b0->pp).pic_height;
        }
        if ((((ulong)pHVar5->rc_task->frm & 8) == 0) && ((MVar7 & 0xf00000) != MPP_FMT_YUV420SP)) {
          RVar8 = mpp_frame_get_fbc_offset(pHVar5->frame);
LAB_00257b02:
          RVar13 = 0;
        }
        else {
          RVar8 = (uint)uVar18 * (uint)(local_b0->pp).hor_stride;
          switch(uVar16) {
          case 0:
          case 1:
          case 2:
          case 8:
          case 9:
          case 10:
            RVar8 = 0;
            goto LAB_00257b02;
          default:
            _mpp_log_l(2,"hal_h265e_v580","unknown color space: %d\n","vepu580_h265_set_patch_info",
                       (ulong)uVar16);
          case 7:
            RVar13 = RVar8 * 5 >> 2;
            break;
          case 4:
          case 6:
          case 0xc:
            RVar13 = RVar8;
            break;
          case 5:
            RVar13 = RVar8 * 3 >> 1;
            break;
          case 0xd:
            RVar13 = RVar8 * 2;
          }
        }
        MVar9 = mpp_dev_multi_offset_update(pMVar4,0xa1,RVar8);
        if (MVar9 != MPP_OK) {
          _mpp_log_l(2,"hal_h265e_v580","set input cb addr offset failed %d\n",
                     "vepu580_h265_set_patch_info",(ulong)(uint)MVar9);
        }
        MVar9 = mpp_dev_multi_offset_update(pMVar4,0xa2,RVar13);
        if (MVar9 != MPP_OK) {
          _mpp_log_l(2,"hal_h265e_v580","set input cr addr offset failed %d\n",
                     "vepu580_h265_set_patch_info",(ulong)(uint)MVar9);
        }
        lVar31 = local_98;
        local_80 = (hevc_vepu580_base *)__dest->reserved184_191;
        if (1 < (uint)local_40) {
          hal_h265e_v580_set_uniform_tile(local_80,local_b0,(RK_U32)uVar21,(RK_S32)local_90);
        }
        if (uVar21 != 0) {
          aVar10 = (anon_struct_4_4_5bc86bfe_for_reg0200_src_udfu)
                   mpp_buffer_get_fd_with_caller
                             (*(MppBuffer *)(lVar31 + 400 + uVar21 * 8),"hal_h265e_v580_start");
          __dest->reg0200_src_udfu = aVar10;
          aVar11 = (anon_struct_4_4_5bc8e43d_for_reg0201_src_udfv)
                   mpp_buffer_get_fd_with_caller
                             (*(MppBuffer *)(lVar31 + 0x188 + uVar21 * 8),"hal_h265e_v580_start");
          pHVar5 = local_a8;
          __dest->reg0201_src_udfv = aVar11;
          if (*(int *)((long)hal + 0xec) == 0) {
            sVar15 = mpp_packet_get_length(local_a8->packet);
            RVar8 = (int)sVar15 + local_9c;
            aVar12 = (anon_struct_4_4_3b0f98d5_for_reg0196_enc_rsl)
                     mpp_buffer_get_fd_with_caller(pHVar5->output,"hal_h265e_v580_start");
            lVar17 = 0x94;
            ppvVar32 = local_60;
          }
          else {
            ppvVar32 = (MppBuffer *)(local_58 + (uVar21 - 1) * 8);
            aVar12 = (anon_struct_4_4_3b0f98d5_for_reg0196_enc_rsl)
                     mpp_buffer_get_fd_with_caller(*ppvVar32,"hal_h265e_v580_start");
            __dest->reg0196_enc_rsl = aVar12;
            __dest->reg0197_src_fill = (anon_struct_4_4_c09dc813_for_reg0197_src_fill)aVar12;
            __dest->reg0198_src_fmt = (anon_struct_4_6_4b431ccf_for_reg0198_src_fmt)aVar12;
            RVar8 = 0;
            lVar17 = 0x9c;
          }
          *(anon_struct_4_4_3b0f98d5_for_reg0196_enc_rsl *)
           ((long)__dest->reserved184_191 + lVar17 + -0x60) = aVar12;
          mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar31 + 0x218),0xaf,RVar8);
          pMVar4 = *(MppDevRegOffCfgs **)(lVar31 + 0x218);
          sVar15 = mpp_buffer_get_size_with_caller(*ppvVar32,"hal_h265e_v580_start");
          mpp_dev_multi_offset_update(pMVar4,0xac,(RK_U32)sVar15);
          RVar8 = *(RK_U32 *)((long)hal + 0x138);
          mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar31 + 0x218),0xa6,RVar8);
          mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar31 + 0x218),0xa4,RVar8);
        }
        ppvVar32 = local_78;
        if (((ulong)local_a8->rc_task->frm & 4) != 0) {
          RVar8 = (local_b0->pp).field_22.CodingSettingPicturePropertyFlags;
          lVar31 = *(long *)((long)hal + 0x80);
          uVar25 = *(int *)(*(long *)((long)hal + 200) + 0xc) + 0x3fU & 0xffffffc0;
          uVar16 = *(int *)(*(long *)((long)hal + 200) + 0x10) + 0xfU & 0xfffffff0;
          if ((*(long *)((long)hal + 0xf8) == 0) &&
             (iVar28 = uVar16 * uVar25,
             mpp_buffer_get_with_tag
                       ((MppBufferGroup)0x0,local_78,(long)((iVar28 >> 1) + iVar28),"hal_h265e_v580"
                        ,"vepu580_h265e_save_pass1_patch"), *ppvVar32 == (MppBuffer)0x0)) {
            _mpp_log_l(2,"hal_h265e_v580","buf_pass1 malloc fail, debreath invaild",(char *)0x0);
          }
          else {
            *(byte *)&__dest->reg0216_sli_splt = *(byte *)&__dest->reg0216_sli_splt | 4;
            RVar13 = mpp_buffer_get_fd_with_caller(*local_78,"vepu580_h265e_save_pass1_patch");
            __dest->reserved184_191[3] = RVar13;
            __dest->reserved184_191[4] = RVar13;
            puVar1 = &(__dest->reg0216_sli_splt).field_0x3;
            *puVar1 = *puVar1 | 0x80;
            if ((char)RVar8 < '\0') {
              pbVar2 = (byte *)((long)&__dest[1].reg0168_cmvr_addr + 2);
              *pbVar2 = *pbVar2 & 0xdf;
            }
            mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar31 + 0x218),0xa4,uVar16 * uVar25)
            ;
            *(byte *)&__dest->reg0240_synt_sli1 = *(byte *)&__dest->reg0240_synt_sli1 & 0xfe;
            puVar1 = &(__dest->reg0216_sli_splt).field_0x3;
            *puVar1 = *puVar1 & 0xbf;
          }
        }
        if (((ulong)local_a8->rc_task->frm & 8) != 0) {
          lVar31 = *(long *)((long)hal + 0x80);
          uVar16 = *(int *)(*(long *)((long)hal + 200) + 0xc) + 0x3f;
          uVar25 = uVar16 & 0xffffffc0;
          RVar13 = (*(int *)(*(long *)((long)hal + 200) + 0x10) + 0xfU & 0x3fffff0) * uVar25;
          __dest->reg0172_bsbt_addr =
               __dest->reg0172_bsbt_addr & 0xffffff0f |
               (*(uint *)(*(long *)((long)hal + 0x110) + 0x10) & 0xf) << 4;
          __dest->reg0222_me_cach =
               (anon_struct_4_5_b98367b4_for_reg0222_me_cach)
               ((uint)__dest->reg0222_me_cach & 0xffffff40 | 0x98);
          __dest->reserved229_231[0] = __dest->reserved229_231[0] & 0xfffe0000 | uVar16 & 0x1ffc0;
          *(short *)(__dest->reserved229_231 + 1) = (short)uVar25;
          pbVar2 = (byte *)((long)__dest->reserved225_227 + 0xb);
          *pbVar2 = *pbVar2 & 0xa3;
          __dest->reg0228_roi_en =
               (anon_struct_4_4_e91501b4_for_reg0228_roi_en)
               ((uint)__dest->reg0228_roi_en & 0xc000c000);
          RVar8 = mpp_buffer_get_fd_with_caller
                            (*(MppBuffer *)((long)hal + 0xf8),"vepu580_h265e_use_pass1_patch");
          __dest->reserved184_191[0] = RVar8;
          __dest->reserved184_191[1] = RVar8;
          __dest->reserved184_191[2] = RVar8;
          MVar9 = mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar31 + 0x218),0xa1,RVar13);
          if (MVar9 != MPP_OK) {
            _mpp_log_l(2,"hal_h265e_v580","set input cb addr offset failed %d\n",
                       "vepu580_h265e_use_pass1_patch",(ulong)(uint)MVar9);
          }
          MVar9 = mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar31 + 0x218),0xa2,RVar13);
          if (MVar9 != MPP_OK) {
            _mpp_log_l(2,"hal_h265e_v580","set input cr addr offset failed %d\n",
                       "vepu580_h265e_use_pass1_patch",(ulong)(uint)MVar9);
          }
        }
        ctx = *(MppDev *)((long)hal + 0x68);
        local_b8 = 0x60;
        local_c0 = __dest;
        MVar9 = mpp_dev_ioctl(ctx,4,&local_c0);
        if (MVar9 == MPP_OK) {
          if (((byte)hal_h265e_debug & 0x20) != 0) {
            uVar20 = 0;
            do {
              if (((byte)hal_h265e_debug & 0x20) != 0) {
                _mpp_log_l(4,"hal_h265e_v580","ctl reg[%04x]: 0%08x\n",(char *)0x0,
                           uVar20 & 0xffffffff,
                           (ulong)*(uint *)((long)__dest->reserved184_191 + (uVar20 - 0x60)));
              }
              uVar20 = uVar20 + 4;
            } while (uVar20 != 0x60);
          }
          local_c0 = local_80;
          local_b8 = 0x28000000178;
          MVar9 = mpp_dev_ioctl(ctx,4,&local_c0);
          phVar6 = local_80;
          if (MVar9 != MPP_OK) goto LAB_00257fbd;
          if (((byte)hal_h265e_debug & 0x10) != 0) {
            uVar20 = 0;
            do {
              if (((byte)hal_h265e_debug & 0x10) != 0) {
                _mpp_log_l(4,"hal_h265e_v580","hw add cfg reg[%04x]: 0%08x\n",(char *)0x0,
                           uVar20 & 0xffffffff,
                           (ulong)*(uint *)((long)phVar6->reserved184_191 + (uVar20 - 0x60)));
              }
              uVar20 = uVar20 + 4;
            } while (uVar20 != 0x80);
            uVar20 = 0;
            do {
              if (((byte)hal_h265e_debug & 0x10) != 0) {
                _mpp_log_l(4,"hal_h265e_v580","set reg[%04x]: 0%08x\n",(char *)0x0,
                           uVar20 & 0xffffffff,
                           (ulong)*(uint *)((long)__dest->reserved207_211 + uVar20 + 0x24));
              }
              uVar20 = uVar20 + 4;
            } while (uVar20 != 0xf8);
          }
          local_b8 = 0x1000000000e4;
          local_c0 = (hevc_vepu580_base *)__dest[1].reserved184_191;
          MVar9 = mpp_dev_ioctl(ctx,4,&local_c0);
          if (((byte)hal_h265e_debug & 0x40) != 0) {
            uVar20 = 0;
            do {
              if (((byte)hal_h265e_debug & 0x40) != 0) {
                _mpp_log_l(4,"hal_h265e_v580","set reg[%04x]: 0%08x\n",(char *)0x0,
                           uVar20 & 0xffffffff,
                           (ulong)*(uint *)((long)__dest[1].reserved184_191 + uVar20));
              }
              uVar20 = uVar20 + 4;
            } while (uVar20 != 0xe4);
          }
          if (MVar9 == MPP_OK) {
            local_b8 = 0x1700000005d8;
            local_c0 = (hevc_vepu580_base *)&__dest[1].reg0241_synt_sli2;
            MVar9 = mpp_dev_ioctl(ctx,4,&local_c0);
            if (MVar9 != MPP_OK) {
LAB_0025833f:
              fmt = "set register write failed %d\n";
              goto LAB_00258358;
            }
            if (((byte)hal_h265e_debug & 0x80) != 0) {
              uVar20 = 0;
              do {
                if (((byte)hal_h265e_debug & 0x80) != 0) {
                  _mpp_log_l(4,"hal_h265e_v580","set reg[%04x]: 0%08x\n",(char *)0x0,
                             uVar20 & 0xffffffff,
                             (ulong)*(uint *)((long)&__dest[1].reg0241_synt_sli2 + 0x60 +
                                             (uVar20 - 0x60)));
                }
                uVar20 = uVar20 + 4;
              } while (uVar20 != 0x5d8);
            }
            local_c0 = (hevc_vepu580_base *)&__dest[5].reg0239_synt_sli0;
            local_b8 = 0x200000000c9c;
            MVar9 = mpp_dev_ioctl(ctx,4,&local_c0);
            if (MVar9 != MPP_OK) goto LAB_0025833f;
            local_c0 = (hevc_vepu580_base *)&__dest[0xe].reg0200_src_udfu;
            local_b8 = 0x300000000480;
            MVar9 = mpp_dev_ioctl(ctx,4,&local_c0);
            if (MVar9 != MPP_OK) goto LAB_00257fbd;
            local_70 = local_88;
            local_68 = 0x2c00000004;
            MVar9 = mpp_dev_ioctl(ctx,5,&local_70);
            if (MVar9 == MPP_OK) {
              local_70 = (void *)((long)local_88 + 4);
              local_68 = 0x4000000002d0;
              MVar9 = mpp_dev_ioctl(ctx,5,&local_70);
              if (MVar9 != MPP_OK) goto LAB_0025846a;
            }
            else {
LAB_0025846a:
              _mpp_log_l(2,"hal_h265e_v580","set register read failed %d\n",
                         "hal_h265e_v580_send_regs",(ulong)(uint)MVar9);
            }
          }
          else {
            fmt = "set rc kult  write failed %d\n";
LAB_00258358:
            _mpp_log_l(2,"hal_h265e_v580",fmt,"hal_h265e_v580_send_regs",(ulong)(uint)MVar9);
          }
        }
        else {
LAB_00257fbd:
          _mpp_log_l(2,"hal_h265e_v580","set register write failed %d\n","hal_h265e_v580_send_regs",
                     (ulong)(uint)MVar9);
        }
        lVar31 = local_98;
        mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),7,*(void **)(local_98 + 0x218));
        if (uVar21 < local_48) {
          if (*(int *)((long)hal + 0xec) == 0) {
            MVar9 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0xf,(void *)0x0);
            if (MVar9 != MPP_OK) {
              _mpp_log_l(2,"hal_h265e_v580","send cmd failed %d\n","hal_h265e_v580_start",
                         (ulong)(uint)MVar9);
            }
            MVar9 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0x10,(void *)0x0);
            if (MVar9 != MPP_OK) {
              _mpp_log_l(2,"hal_h265e_v580","poll cmd failed %d\n","hal_h265e_v580_start",
                         (ulong)(uint)MVar9);
            }
            iVar28 = *(int *)((long)local_88 + 4);
            *(int *)(lVar31 + 0x5c) = *(int *)(lVar31 + 0x5c) + *(int *)((long)local_88 + 0x10);
            *(int *)(lVar31 + 0x60) = *(int *)(lVar31 + 0x60) + iVar28;
            *(long *)(lVar31 + 0x68) =
                 *(long *)(lVar31 + 0x68) +
                 (ulong)(*(int *)((long)local_88 + 0xc) << 0x10 |
                        *(uint *)((long)local_88 + 8) >> 0x10);
            *(int *)(lVar31 + 0x164) = *(int *)(lVar31 + 0x164) + *(int *)((long)local_88 + 300);
            *(int *)(lVar31 + 0x160) = *(int *)(lVar31 + 0x160) + *(int *)((long)local_88 + 0x124);
            local_9c = local_9c + iVar28;
            *(int *)(lVar31 + 0x188) =
                 *(int *)(lVar31 + 0x188) + (*(uint *)((long)local_88 + 0x130) & 0x7fffff);
            *(int *)(lVar31 + 0x18c) =
                 *(int *)(lVar31 + 0x18c) + (*(uint *)((long)local_88 + 0x128) & 0x1fffff);
          }
          else {
            mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),2,(void *)0x0);
          }
        }
        local_90 = (ulong)((int)local_90 + (local_b0->pp).column_width_minus1[uVar21] + 1);
        uVar21 = uVar21 + 1;
        if (uVar21 == local_50) {
          MVar9 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0xf,(void *)0x0);
          if (MVar9 != MPP_OK) {
            _mpp_log_l(2,"hal_h265e_v580","send cmd failed %d\n","hal_h265e_v580_start",
                       (ulong)(uint)MVar9);
          }
          if (((byte)hal_h265e_debug & 4) == 0) {
            return MVar9;
          }
          _mpp_log_l(4,"hal_h265e_v580","(%d) leave\n",(char *)0x0,0xbb9);
          return MVar9;
        }
      } while( true );
    }
    _mpp_log_l(4,"hal_h265e_v580","tile_num big then support %d, max %d",(char *)0x0,(ulong)uVar16,4
              );
  }
  else {
    _mpp_log_l(2,"hal_h265e_v580","enc_task->flags.err %08x, return e arly","hal_h265e_v580_start");
  }
  return MPP_NOK;
}

Assistant:

MPP_RET hal_h265e_v580_start(void *hal, HalEncTask *enc_task)
{
    H265eV580HalContext *ctx = (H265eV580HalContext *)hal;
    H265eSyntax_new *syn = ctx->syn;
    RK_U32 tile_num = (syn->pp.num_tile_columns_minus1 + 1) * (syn->pp.num_tile_rows_minus1 + 1);
    RK_U32 stream_len = 0;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    Vepu580H265eFrmCfg *frm = ctx->frm;
    RK_U32 k = 0;
    MPP_RET ret = MPP_OK;
    RK_S32 tile_start_x = 0;

    hal_h265e_enter();

    ctx->tile_num = tile_num;

    if (enc_task->flags.err) {
        hal_h265e_err("enc_task->flags.err %08x, return e arly",
                      enc_task->flags.err);
        return MPP_NOK;
    }

    if (tile_num > MAX_TILE_NUM) {
        mpp_log("tile_num big then support %d, max %d", tile_num, MAX_TILE_NUM);
        return MPP_NOK;
    }

    for (k = 0; k < tile_num; k++) {
        H265eV580RegSet *hw_regs = frm->regs_set[k];
        hevc_vepu580_base *reg_base = NULL;
        H265eV580StatusElem *reg_out = frm->regs_ret[k];

        if (!hw_regs) {
            hw_regs = mpp_malloc(H265eV580RegSet, 1);
            frm->regs_set[k] = hw_regs;
        }
        if (!reg_out) {
            reg_out = mpp_malloc(H265eV580StatusElem, 1);
            frm->regs_ret[k] = reg_out;
        }

        reg_base = &hw_regs->reg_base;

        if (k)
            memcpy(hw_regs, frm->regs_set[0], sizeof(*hw_regs));

        vepu580_h265_set_me_ram(syn, reg_base, k, tile_start_x);

        /* set input info */
        vepu580_h265_set_patch_info(frm->reg_cfg, syn, (Vepu541Fmt)fmt->format, enc_task);
        if (tile_num > 1)
            hal_h265e_v580_set_uniform_tile(reg_base, syn, k, tile_start_x);

        if (k) {
            RK_U32 offset = 0;

            reg_base->reg0176_lpfw_addr  = mpp_buffer_get_fd(frm->hw_tile_buf[k]);
            reg_base->reg0177_lpfr_addr  = mpp_buffer_get_fd(frm->hw_tile_buf[k - 1]);

            if (!ctx->tile_parall_en) {
                offset = mpp_packet_get_length(enc_task->packet);
                offset += stream_len;

                reg_base->reg0173_bsbb_addr = mpp_buffer_get_fd(enc_task->output);

                mpp_dev_multi_offset_update(frm->reg_cfg, 175, offset);
                mpp_dev_multi_offset_update(frm->reg_cfg, 172, mpp_buffer_get_size(enc_task->output));
            } else {
                reg_base->reg0172_bsbt_addr = mpp_buffer_get_fd(frm->hw_tile_stream[k - 1]);
                /* TODO: stream size relative with syntax */
                reg_base->reg0173_bsbb_addr = reg_base->reg0172_bsbt_addr;
                reg_base->reg0174_bsbr_addr = reg_base->reg0172_bsbt_addr;
                reg_base->reg0175_adr_bsbs  = reg_base->reg0172_bsbt_addr;

                mpp_dev_multi_offset_update(frm->reg_cfg, 175, 0);
                mpp_dev_multi_offset_update(frm->reg_cfg, 172, mpp_buffer_get_size(frm->hw_tile_stream[k - 1]));
            }

            offset = ctx->fbc_header_len;

            mpp_dev_multi_offset_update(frm->reg_cfg, 166, offset);
            mpp_dev_multi_offset_update(frm->reg_cfg, 164, offset);
        }

        if (enc_task->rc_task->frm.save_pass1)
            vepu580_h265e_save_pass1_patch(hw_regs, ctx, syn->pp.tiles_enabled_flag);

        if (enc_task->rc_task->frm.use_pass1)
            vepu580_h265e_use_pass1_patch(hw_regs, ctx);

        hal_h265e_v580_send_regs(ctx->dev, hw_regs, reg_out);

        mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_OFFS, frm->reg_cfg);

        if (k < tile_num - 1) {
            if (!ctx->tile_parall_en) {
                Vepu580H265Fbk *fb = &frm->feedback;

                ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
                if (ret) {
                    mpp_err_f("send cmd failed %d\n", ret);
                }

                ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
                if (ret) {
                    mpp_err_f("poll cmd failed %d\n", ret);
                    ret = MPP_ERR_VPUHW;
                }
                stream_len += reg_out->st.bs_lgth_l32;
                fb->qp_sum += reg_out->st.qp_sum;
                fb->out_strm_size += reg_out->st.bs_lgth_l32;
                fb->sse_sum += (RK_S64)(reg_out->st.sse_h32 << 16) +
                               (reg_out->st.st_sse_bsl.sse_l16 & 0xffff);
                fb->st_madi += reg_out->st.madi;
                fb->st_madp += reg_out->st.madp;
                fb->st_mb_num += reg_out->st.st_bnum_b16.num_b16;
                fb->st_ctu_num += reg_out->st.st_bnum_cme.num_ctu;
            } else
                mpp_dev_ioctl(ctx->dev, MPP_DEV_DELIMIT, NULL);
        }
        tile_start_x += (syn->pp.column_width_minus1[k] + 1);
    }

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
    if (ret) {
        mpp_err_f("send cmd failed %d\n", ret);
    }
    hal_h265e_leave();
    return ret;
}